

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void google::protobuf::internal::MapMergeFrom<bool,proto2_unittest::Proto2MapEnumPlusExtra>
               (Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *dest,
               Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *src)

{
  Proto2MapEnumPlusExtra PVar1;
  bool bVar2;
  reference key;
  Proto2MapEnumPlusExtra *pPVar3;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *__range3;
  Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *src_local;
  Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *dest_local;
  
  Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra>::begin
            ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,src);
  Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra>::end((const_iterator *)&elem,src);
  while( true ) {
    bVar2 = protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&elem);
    if (!bVar2) break;
    key = Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra>::const_iterator::operator*
                    ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    PVar1 = key->second;
    pPVar3 = Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra>::operator[]<bool>(dest,&key->first);
    *pPVar3 = PVar1;
    Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra>::const_iterator::operator++
              ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}